

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_resample.c
# Opt level: O3

t_int * upsampling_perform_hold(t_int *w)

{
  long lVar1;
  t_int tVar2;
  long lVar3;
  long lVar4;
  undefined4 *puVar5;
  undefined4 *puVar6;
  long lVar7;
  
  if ((int)w[3] != 0) {
    lVar1 = w[1];
    tVar2 = w[4];
    lVar3 = (long)(int)w[3];
    puVar5 = (undefined4 *)(w[2] + lVar3 * 4);
    lVar4 = lVar3;
    do {
      puVar5 = puVar5 + -1;
      if ((int)tVar2 != 0) {
        lVar7 = 0;
        puVar6 = puVar5;
        do {
          *puVar6 = *(undefined4 *)(lVar1 + lVar7 * 4);
          lVar7 = lVar7 + 1;
          puVar6 = puVar6 + lVar3;
        } while ((int)tVar2 != (int)lVar7);
      }
      lVar4 = lVar4 + -1;
    } while (lVar4 != 0);
  }
  return w + 5;
}

Assistant:

t_int *upsampling_perform_hold(t_int *w)
{
  t_sample *in  = (t_sample *)(w[1]); /* original signal     */
  t_sample *out = (t_sample *)(w[2]); /* upsampled signal    */
  int up       = (int)(w[3]);       /* upsampling factor   */
  int parent   = (int)(w[4]);       /* original vectorsize */
  int i=up;

  int n=parent;
  t_sample *dum_out = out;
  t_sample *dum_in  = in;

  while (i--) {
    n = parent;
    out = dum_out+i;
    in  = dum_in;
    while(n--){
      *out=*in++;
      out+=up;
    }
  }
  return (w+5);
}